

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  JNIEnv *pJVar1;
  jclass cls;
  jclass p_Var2;
  jstring p_Var3;
  jobjectArray p_Var4;
  jmethodID methodID;
  jthrowable p_Var5;
  runtime_error *this;
  long lVar6;
  ulong uVar7;
  JNIEnv *env;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  JavaVM *jvm;
  JavaVMInitArgs vm_args;
  JNIEnv *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50;
  undefined8 local_48;
  undefined8 *puStack_40;
  undefined8 local_38;
  
  puStack_40 = (undefined8 *)operator_new__(0xc0);
  *puStack_40 = "-Xmx7G";
  puStack_40[2] = "-XX:+UseConcMarkSweepGC";
  puStack_40[4] = "-XX:+CMSIncrementalMode";
  puStack_40[6] = "-XX:-UseAdaptiveSizePolicy";
  puStack_40[8] = "-Xmn4G";
  puStack_40[10] = "-Djava.library.path=/home/loulfy/ATLauncher/Instances/DNSTechpack/bin/natives/";
  puStack_40[0xc] =
       "-Djava.class.path=/home/loulfy/Instances/DNSTechpack/jarmods/forge-1.12.2-14.23.1.2555-universal.jar:/home/loulfy/Instances/DNSTechpack/jarmods/dnsTitleLogo-v2.zip:/home/loulfy/Instances/DNSTechpack/bin/launchwrapper-1.12.jar:/home/loulfy/Instances/DNSTechpack/bin/asm-all-5.2.jar:/home/loulfy/Instances/DNSTechpack/bin/jline-2.13.jar:/home/loulfy/Instances/DNSTechpack/bin/akka-actor_2.11-2.3.3.jar:/home/loulfy/Instances/DNSTechpack/bin/config-1.2.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-actors-migration_2.11-1.1.0.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-compiler-2.11.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-continuations-library_2.11-1.0.2.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-continuations-plugin_2.11.1-1.0.2.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-library-2.11.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-parser-combinators_2.11-1.0.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-reflect-2.11.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-swing_2.11-1.0.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-xml_2.11-1.0.2.jar:/home/loulfy/Instances/DNSTechpack/bin/lzma-0.0.1.jar:/home/loulfy/Instances/DNSTechpack/bin/jopt-simple-5.0.3.jar:/home/loulfy/Instances/DNSTechpack/bin/vecmath-1.5.2.jar:/home/loulfy/Instances/DNSTechpack/bin/trove4j-3.0.3.jar:/home/loulfy/Instances/DNSTechpack/bin/patchy-1.1.jar:/home/loulfy/Instances/DNSTechpack/bin/oshi-core-1.1.jar:/home/loulfy/Instances/DNSTechpack/bin/jna-4.4.0.jar:/home/loulfy/Instances/DNSTechpack/bin/platform-3.4.0.jar:/home/loulfy/Instances/DNSTechpack/bin/icu4j-core-mojang-51.2.jar:/home/loulfy/Instances/DNSTechpack/bin/codecjorbis-20101023.jar:/home/loulfy/Instances/DNSTechpack/bin/codecwav-20101023.jar:/home/loulfy/Instances/DNSTechpack/bin/libraryjavasound-20101123.jar:/home/loulfy/Instances/DNSTechpack/bin/librarylwjglopenal-20100824.jar:/home/loulfy/Instances/DNSTechpack/bin/soundsystem-20120107.jar:/home/loulfy/Instances/DNSTechpack/bin/netty-all-4.1.9.Final.jar:/home/loulfy/Instances/DNSTechpack/bi..." /* TRUNCATED STRING LITERAL */
  ;
  puStack_40[0xe] = "-XX:MetaspaceSize=1024M";
  puStack_40[0x10] = "-XX:-OmitStackTraceInFastThrow";
  local_48 = 0x900010008;
  local_38 = 0;
  JNI_CreateJavaVM(&local_50,&local_70);
  cls = (*local_70->functions->FindClass)(local_70,"net/minecraft/launchwrapper/Launch");
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[63]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
             (char (*) [63])"--tweakClass=net.minecraftforge.fml.common.launcher.FMLTweaker");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
             (char (*) [14])"--accessToken");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
             (char (*) [10])"123456789");
  pJVar1 = local_70;
  uVar7 = (long)local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (*local_70->functions->FindClass)(local_70,"java/lang/String");
  p_Var3 = (*local_70->functions->NewStringUTF)(local_70,"");
  p_Var4 = (*pJVar1->functions->NewObjectArray)(pJVar1,(jsize)(uVar7 >> 5),p_Var2,(jobject)p_Var3);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pJVar1 = local_70;
      p_Var3 = (*local_70->functions->NewStringUTF)
                         (local_70,*(char **)((long)&((local_68.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar6));
      (*pJVar1->functions->SetObjectArrayElement)(pJVar1,p_Var4,(jsize)uVar7,(jobject)p_Var3);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar7 < (ulong)((long)local_68.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_68.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (cls != (jclass)0x0) {
    methodID = (*local_70->functions->GetStaticMethodID)
                         (local_70,cls,"main","([Ljava/lang/String;)V");
    JNIEnv_::CallStaticVoidMethod(local_70,cls,methodID,p_Var4);
    p_Var5 = (*local_70->functions->ExceptionOccurred)(local_70);
    if (p_Var5 != (jthrowable)0x0) {
      (*local_70->functions->ExceptionDescribe)(local_70);
    }
    (**(code **)(*local_50 + 0x18))();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    return 0;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"CLASS NOT FOUND");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    JavaVM *jvm;       /* denotes a Java VM */
    JNIEnv *env;       /* pointer to native method interface */

    auto options = new JavaVMOption[12];
    options[0].optionString = const_cast<char *>("-Xmx7G");
    options[1].optionString = const_cast<char *>("-XX:+UseConcMarkSweepGC");
    options[2].optionString = const_cast<char *>("-XX:+CMSIncrementalMode");
    options[3].optionString = const_cast<char *>("-XX:-UseAdaptiveSizePolicy");
    options[4].optionString = const_cast<char *>("-Xmn4G");
    options[5].optionString = const_cast<char *>("-Djava.library.path=/home/loulfy/ATLauncher/Instances/DNSTechpack/bin/natives/");
    options[6].optionString = const_cast<char *>("-Djava.class.path=/home/loulfy/Instances/DNSTechpack/jarmods/forge-1.12.2-14.23.1.2555-universal.jar:/home/loulfy/Instances/DNSTechpack/jarmods/dnsTitleLogo-v2.zip:/home/loulfy/Instances/DNSTechpack/bin/launchwrapper-1.12.jar:/home/loulfy/Instances/DNSTechpack/bin/asm-all-5.2.jar:/home/loulfy/Instances/DNSTechpack/bin/jline-2.13.jar:/home/loulfy/Instances/DNSTechpack/bin/akka-actor_2.11-2.3.3.jar:/home/loulfy/Instances/DNSTechpack/bin/config-1.2.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-actors-migration_2.11-1.1.0.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-compiler-2.11.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-continuations-library_2.11-1.0.2.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-continuations-plugin_2.11.1-1.0.2.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-library-2.11.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-parser-combinators_2.11-1.0.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-reflect-2.11.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-swing_2.11-1.0.1.jar:/home/loulfy/Instances/DNSTechpack/bin/scala-xml_2.11-1.0.2.jar:/home/loulfy/Instances/DNSTechpack/bin/lzma-0.0.1.jar:/home/loulfy/Instances/DNSTechpack/bin/jopt-simple-5.0.3.jar:/home/loulfy/Instances/DNSTechpack/bin/vecmath-1.5.2.jar:/home/loulfy/Instances/DNSTechpack/bin/trove4j-3.0.3.jar:/home/loulfy/Instances/DNSTechpack/bin/patchy-1.1.jar:/home/loulfy/Instances/DNSTechpack/bin/oshi-core-1.1.jar:/home/loulfy/Instances/DNSTechpack/bin/jna-4.4.0.jar:/home/loulfy/Instances/DNSTechpack/bin/platform-3.4.0.jar:/home/loulfy/Instances/DNSTechpack/bin/icu4j-core-mojang-51.2.jar:/home/loulfy/Instances/DNSTechpack/bin/codecjorbis-20101023.jar:/home/loulfy/Instances/DNSTechpack/bin/codecwav-20101023.jar:/home/loulfy/Instances/DNSTechpack/bin/libraryjavasound-20101123.jar:/home/loulfy/Instances/DNSTechpack/bin/librarylwjglopenal-20100824.jar:/home/loulfy/Instances/DNSTechpack/bin/soundsystem-20120107.jar:/home/loulfy/Instances/DNSTechpack/bin/netty-all-4.1.9.Final.jar:/home/loulfy/Instances/DNSTechpack/bin/guava-21.0.jar:/home/loulfy/Instances/DNSTechpack/bin/commons-lang3-3.5.jar:/home/loulfy/Instances/DNSTechpack/bin/commons-io-2.5.jar:/home/loulfy/Instances/DNSTechpack/bin/commons-codec-1.10.jar:/home/loulfy/Instances/DNSTechpack/bin/jinput-2.0.5.jar:/home/loulfy/Instances/DNSTechpack/bin/jutils-1.0.0.jar:/home/loulfy/Instances/DNSTechpack/bin/gson-2.8.0.jar:/home/loulfy/Instances/DNSTechpack/bin/authlib-1.5.25.jar:/home/loulfy/Instances/DNSTechpack/bin/realms-1.10.17.jar:/home/loulfy/Instances/DNSTechpack/bin/commons-compress-1.8.1.jar:/home/loulfy/Instances/DNSTechpack/bin/httpclient-4.3.3.jar:/home/loulfy/Instances/DNSTechpack/bin/commons-logging-1.1.3.jar:/home/loulfy/Instances/DNSTechpack/bin/httpcore-4.3.2.jar:/home/loulfy/Instances/DNSTechpack/bin/fastutil-7.1.0.jar:/home/loulfy/Instances/DNSTechpack/bin/log4j-api-2.8.1.jar:/home/loulfy/Instances/DNSTechpack/bin/log4j-core-2.8.1.jar:/home/loulfy/Instances/DNSTechpack/bin/lwjgl-2.9.4-nightly-20150209.jar:/home/loulfy/Instances/DNSTechpack/bin/lwjgl_util-2.9.4-nightly-20150209.jar:/home/loulfy/Instances/DNSTechpack/bin/text2speech-1.10.3.jar:/home/loulfy/Instances/DNSTechpack/bin/minecraft.jar");
    options[7].optionString = const_cast<char *>("-XX:MetaspaceSize=1024M");
    options[8].optionString = const_cast<char *>("-XX:-OmitStackTraceInFastThrow");

    JavaVMInitArgs vm_args{};
    vm_args.version = JNI_VERSION_1_8;
    vm_args.nOptions = 9;
    vm_args.options = options;
    vm_args.ignoreUnrecognized = JNI_FALSE;
    //JNI_GetDefaultJavaVMInitArgs(&vm_args);

    JNI_CreateJavaVM(&jvm, reinterpret_cast<void**>(&env), &vm_args);
    jclass cls = env->FindClass("net/minecraft/launchwrapper/Launch");

    std::vector<std::string> params;
    params.emplace_back("--tweakClass=net.minecraftforge.fml.common.launcher.FMLTweaker");
    params.emplace_back("--accessToken");
    params.emplace_back("123456789");
    auto arr = env->NewObjectArray(static_cast<jsize>(params.size()), env->FindClass("java/lang/String"), env->NewStringUTF(""));
    for(int i=0; i < params.size(); i++)
        env->SetObjectArrayElement(arr,i,env->NewStringUTF(params[i].c_str()));

    if(cls == nullptr) throw std::runtime_error("CLASS NOT FOUND");

    jmethodID MainMethod = env->GetStaticMethodID(cls, "main", "([Ljava/lang/String;)V");
    env->CallStaticVoidMethod(cls, MainMethod, arr);

    if (env->ExceptionOccurred()) {
        env->ExceptionDescribe();
    }

    jvm->DestroyJavaVM();

    return 0;
}